

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

void do_cmd_wiz_perform_effect(command_conflict *cmd)

{
  wchar_t index_00;
  _Bool _Var1;
  source sVar2;
  source origin;
  _Bool local_d1;
  wchar_t local_d0;
  wchar_t wStack_cc;
  _Bool ident;
  wchar_t x;
  wchar_t y;
  wchar_t p3;
  wchar_t p2;
  wchar_t p1;
  wchar_t index;
  char dice [80];
  char name [80];
  command_conflict *cmd_local;
  
  memset(dice + 0x48,0,0x50);
  memset(&p1,0,0x50);
  p1._0_1_ = 0x30;
  p2 = L'\xffffffff';
  p3 = L'\0';
  y = L'\0';
  x = L'\0';
  wStack_cc = 0;
  local_d0 = 0;
  local_d1 = false;
  screen_save();
  _Var1 = get_string("Do which effect: ",dice + 0x48,0x50);
  if (_Var1) {
    _Var1 = get_int_from_string(dice + 0x48,&p2);
    if (!_Var1) {
      p2 = effect_lookup(dice + 0x48);
    }
    if ((p2 < L'\x01') || (L'\x7f' < p2)) {
      msg("No effect found.");
      return;
    }
  }
  _Var1 = get_string("Enter damage dice (eg 1+2d6M2): ",(char *)&p1,0x50);
  if (!_Var1) {
    my_strcpy((char *)&p1,"0",0x50);
  }
  my_strcpy(dice + 0x48,"0",0x50);
  _Var1 = get_string("Enter name or number for effect subtype: ",dice + 0x48,0x50);
  if ((_Var1) && (p3 = effect_subtype(p2,dice + 0x48), p3 == L'\xffffffff')) {
    p3 = L'\0';
  }
  y = get_quantity("Enter second parameter (radius): ",L'd');
  x = get_quantity("Enter third parameter (other): ",L'd');
  wStack_cc = get_quantity("Enter y parameter: ",L'd');
  local_d0 = get_quantity("Enter x parameter: ",L'd');
  screen_load();
  index_00 = p2;
  sVar2 = source_player();
  origin.which = sVar2.which;
  origin._4_4_ = 0;
  origin.what = sVar2.what;
  effect_simple(index_00,origin,(char *)&p1,p3,y,x,wStack_cc,local_d0,&local_d1);
  if ((local_d1 & 1U) != 0) {
    msg("Identified!");
  }
  return;
}

Assistant:

void do_cmd_wiz_perform_effect(struct command *cmd)
{
	char name[80] = "";
	char dice[80] = "0";
	int index = -1;
	int p1 = 0, p2 = 0, p3 = 0;
	int y = 0, x = 0;
	bool ident = false;

	/* Avoid the prompt getting in the way */
	screen_save();

	/* Get the name */
	if (get_string("Do which effect: ", name, sizeof(name))) {
		/* See if an effect index was entered */
		if (!get_int_from_string(name, &index)) {
			/* If not, find the effect with that name */
			index = effect_lookup(name);
		}

		/* Failed */
		if (index <= EF_NONE || index >= EF_MAX) {
			msg("No effect found.");
			return;
		}
	}

	/* Get the dice */
	if (! get_string("Enter damage dice (eg 1+2d6M2): ", dice,
			sizeof(dice))) {
		my_strcpy(dice, "0", sizeof(dice));
	}

	/* Get the effect subtype */
	my_strcpy(name, "0", sizeof(name));
	if (get_string("Enter name or number for effect subtype: ", name,
			sizeof(name))) {
		/* See if an effect parameter was entered */
		p1 = effect_subtype(index, name);
		if (p1 == -1) p1 = 0;
	}

	/* Get the parameters */
	p2 = get_quantity("Enter second parameter (radius): ", 100);
	p3 = get_quantity("Enter third parameter (other): ", 100);
	y = get_quantity("Enter y parameter: ", 100);
	x = get_quantity("Enter x parameter: ", 100);

	/* Reload the screen */
	screen_load();

	effect_simple(index, source_player(), dice, p1, p2, p3, y, x, &ident);

	if (ident) {
		msg("Identified!");
	}
}